

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_node_choice_child
                 (lysc_ctx *ctx,lysp_node *child_p,lysc_node *node,ly_set *child_set)

{
  lysp_node *plVar1;
  long lVar2;
  lysp_node *pnode;
  long local_50;
  lysc_node_case *cs_c;
  lysp_node_case *cs_p;
  lysp_node *child_p_next;
  LY_ERR ret;
  ly_set *child_set_local;
  lysc_node *node_local;
  lysp_node *child_p_local;
  lysc_ctx *ctx_local;
  
  plVar1 = child_p->next;
  if (child_p->nodetype == 0x80) {
    child_p_next._4_4_ = lys_compile_node(ctx,child_p,node,0,child_set);
  }
  else {
    pnode = (lysp_node *)calloc(1,0x50);
    if (pnode == (lysp_node *)0x0) {
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_compile_node_choice_child");
      return LY_EMEM;
    }
    pnode->nodetype = 0x80;
    child_p_next._4_4_ = lydict_dup(ctx->ctx,child_p->name,&pnode->name);
    if (child_p_next._4_4_ == LY_SUCCESS) {
      pnode[1].parent = child_p;
      child_p->next = (lysp_node *)0x0;
      child_p_next._4_4_ = lys_compile_node(ctx,pnode,node,0,child_set);
      if ((child_p_next._4_4_ == LY_SUCCESS) &&
         (lVar2._0_2_ = node[1].nodetype, lVar2._2_2_ = node[1].flags, lVar2._4_1_ = node[1].hash[0]
         , lVar2._5_1_ = node[1].hash[1], lVar2._6_1_ = node[1].hash[2],
         lVar2._7_1_ = node[1].hash[3], lVar2 != 0)) {
        local_50._0_2_ = node[1].nodetype;
        local_50._2_2_ = node[1].flags;
        local_50._4_1_ = node[1].hash[0];
        local_50._5_1_ = node[1].hash[1];
        local_50._6_1_ = node[1].hash[2];
        local_50._7_1_ = node[1].hash[3];
        while (*(char **)(local_50 + 0x28) != pnode->name) {
          local_50 = *(long *)(local_50 + 0x18);
          if (local_50 == 0) {
            __assert_fail("cs_c",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                          ,0xe51,
                          "LY_ERR lys_compile_node_choice_child(struct lysc_ctx *, struct lysp_node *, struct lysc_node *, struct ly_set *)"
                         );
          }
        }
        if ((ctx->ctx->flags & 0x40) != 0) {
          if (*(lysp_node **)(local_50 + 0x48) != pnode) {
            __assert_fail("cs_c->priv == cs_p",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                          ,0xe58,
                          "LY_ERR lys_compile_node_choice_child(struct lysc_ctx *, struct lysp_node *, struct lysc_node *, struct ly_set *)"
                         );
          }
          *(undefined8 *)(local_50 + 0x48) = 0;
        }
        if (*(long *)(local_50 + 0x50) != 0) {
          *(ushort *)(local_50 + 2) = *(ushort *)(local_50 + 2) & 0xffe3;
          *(ushort *)(local_50 + 2) =
               *(ushort *)(local_50 + 2) | *(ushort *)(*(long *)(local_50 + 0x50) + 2) & 0x1c;
        }
      }
    }
    pnode[1].parent = (lysp_node *)0x0;
    lysp_node_free(&ctx->free_ctx,pnode);
    child_p->next = plVar1;
  }
  return child_p_next._4_4_;
}

Assistant:

LY_ERR
lys_compile_node_choice_child(struct lysc_ctx *ctx, struct lysp_node *child_p, struct lysc_node *node,
        struct ly_set *child_set)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysp_node *child_p_next = child_p->next;
    struct lysp_node_case *cs_p;
    struct lysc_node_case *cs_c;

    if (child_p->nodetype == LYS_CASE) {
        /* standard case under choice */
        ret = lys_compile_node(ctx, child_p, node, 0, child_set);
    } else {
        /* we need the implicit case first, so create a fake parsed (shorthand) case */
        cs_p = calloc(1, sizeof *cs_p);
        LY_CHECK_ERR_RET(!cs_p, LOGMEM(ctx->ctx), LY_EMEM);
        cs_p->nodetype = LYS_CASE;
        DUP_STRING_GOTO(ctx->ctx, child_p->name, cs_p->name, ret, revert_sh_case);
        cs_p->child = child_p;

        /* make the child the only case child */
        child_p->next = NULL;

        /* compile it normally */
        LY_CHECK_GOTO(ret = lys_compile_node(ctx, (struct lysp_node *)cs_p, node, 0, child_set), revert_sh_case);

        if (((struct lysc_node_choice *)node)->cases) {
            /* find our case node */
            cs_c = (struct lysc_node_case *)((struct lysc_node_choice *)node)->cases;
            while (cs_c->name != cs_p->name) {
                cs_c = (struct lysc_node_case *)cs_c->next;
                assert(cs_c);
            }

            if (ctx->ctx->flags & LY_CTX_SET_PRIV_PARSED) {
                /* compiled case node cannot point to his corresponding parsed node
                 * because it exists temporarily so it must be set to NULL
                 */
                assert(cs_c->priv == cs_p);
                cs_c->priv = NULL;
            }

            /* status is copied from his child and not from his parent as usual. */
            if (cs_c->child) {
                cs_c->flags &= ~LYS_STATUS_MASK;
                cs_c->flags |= (LYS_STATUS_MASK & cs_c->child->flags);
            }
        } /* else it was removed by a deviation */

revert_sh_case:
        /* free the parsed shorthand case and correct pointers back */
        cs_p->child = NULL;
        lysp_node_free(&ctx->free_ctx, (struct lysp_node *)cs_p);
        child_p->next = child_p_next;
    }

    return ret;
}